

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave-common-sdl2.cpp
# Opt level: O2

bool GGWave_mainLoop(void)

{
  bool bVar1;
  FILE *__stream;
  char cVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  undefined8 uVar8;
  time_point tVar9;
  allocator_type local_29;
  
  bVar1 = (anonymous_namespace)::g_devIdOut != 0 || (anonymous_namespace)::g_devIdInp != 0;
  tVar9.__d.__r = GGWave_mainLoop::tLastNoData.__d.__r;
  if ((anonymous_namespace)::g_devIdOut != 0 || (anonymous_namespace)::g_devIdInp != 0) {
    cVar2 = GGWave::txHasData();
    if (cVar2 == '\0') {
      SDL_PauseAudioDevice((anonymous_namespace)::g_devIdOut,0);
      if ((GGWave_mainLoop()::tLastNoData == '\0') &&
         (iVar4 = __cxa_guard_acquire(&GGWave_mainLoop()::tLastNoData), iVar4 != 0)) {
        GGWave_mainLoop::tLastNoData.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        __cxa_guard_release(&GGWave_mainLoop()::tLastNoData);
      }
      tVar9.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      iVar4 = SDL_GetQueuedAudioSize((anonymous_namespace)::g_devIdOut);
      iVar5 = GGWave::samplesPerFrame();
      iVar6 = GGWave::sampleSizeOut();
      if (iVar4 < iVar6 * iVar5) {
        SDL_PauseAudioDevice((anonymous_namespace)::g_devIdInp,0);
        iVar4 = SDL_GetQueuedAudioSize((anonymous_namespace)::g_devIdInp);
        iVar5 = GGWave::samplesPerFrame();
        iVar6 = GGWave::sampleSizeInp();
        if ((500.0 < (float)(((long)tVar9.__d.__r - (long)GGWave_mainLoop::tLastNoData.__d.__r) /
                            1000) / 1000.0) && (iVar6 = iVar6 * iVar5, iVar6 <= iVar4)) {
          if ((GGWave_mainLoop()::dataInp == '\0') &&
             (iVar5 = __cxa_guard_acquire(&GGWave_mainLoop()::dataInp), iVar5 != 0)) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      (&GGWave_mainLoop::dataInp,(long)iVar6,&local_29);
            __cxa_atexit(std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector,
                         &GGWave_mainLoop::dataInp,&__dso_handle);
            __cxa_guard_release(&GGWave_mainLoop()::dataInp);
          }
          SDL_DequeueAudio((anonymous_namespace)::g_devIdInp,
                           GGWave_mainLoop::dataInp.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,iVar6);
          cVar2 = GGWave::decode((anonymous_namespace)::g_ggWave,
                                 (uint)GGWave_mainLoop::dataInp.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
          if (cVar2 == '\0') {
            fwrite("Warning: failed to decode input data!\n",0x26,1,_stderr);
          }
          __stream = _stderr;
          if (iVar4 <= iVar6 * 0x20) {
            return bVar1;
          }
          uVar7 = SDL_GetQueuedAudioSize((anonymous_namespace)::g_devIdInp);
          fprintf(__stream,
                  "Warning: slow processing, clearing queued audio buffer of %d bytes ...\n",
                  (ulong)uVar7);
        }
        SDL_ClearQueuedAudio((anonymous_namespace)::g_devIdInp);
        tVar9 = GGWave_mainLoop::tLastNoData;
      }
    }
    else {
      SDL_PauseAudioDevice((anonymous_namespace)::g_devIdOut,1);
      SDL_PauseAudioDevice((anonymous_namespace)::g_devIdInp,1);
      uVar3 = GGWave::encode();
      iVar4 = (anonymous_namespace)::g_devIdOut;
      uVar8 = GGWave::txWaveform();
      SDL_QueueAudio(iVar4,uVar8,uVar3);
      tVar9 = GGWave_mainLoop::tLastNoData;
    }
  }
  GGWave_mainLoop::tLastNoData.__d.__r = tVar9.__d.__r;
  return bVar1;
}

Assistant:

bool GGWave_mainLoop() {
    if (g_devIdInp == 0 && g_devIdOut == 0) {
        return false;
    }

    if (g_ggWave->txHasData() == false) {
        SDL_PauseAudioDevice(g_devIdOut, SDL_FALSE);

        static auto tLastNoData = std::chrono::high_resolution_clock::now();
        auto tNow = std::chrono::high_resolution_clock::now();

        if ((int) SDL_GetQueuedAudioSize(g_devIdOut) < g_ggWave->samplesPerFrame()*g_ggWave->sampleSizeOut()) {
            SDL_PauseAudioDevice(g_devIdInp, SDL_FALSE);
            const int nHave = (int) SDL_GetQueuedAudioSize(g_devIdInp);
            const int nNeed = g_ggWave->samplesPerFrame()*g_ggWave->sampleSizeInp();
            if (::getTime_ms(tLastNoData, tNow) > 500.0f && nHave >= nNeed) {
                static std::vector<uint8_t> dataInp(nNeed);
                SDL_DequeueAudio(g_devIdInp, dataInp.data(), nNeed);

                if (g_ggWave->decode(dataInp.data(), dataInp.size()) == false) {
                    fprintf(stderr, "Warning: failed to decode input data!\n");
                }

                if (nHave > 32*nNeed) {
                    fprintf(stderr, "Warning: slow processing, clearing queued audio buffer of %d bytes ...\n", SDL_GetQueuedAudioSize(g_devIdInp));
                    SDL_ClearQueuedAudio(g_devIdInp);
                }
            } else {
                SDL_ClearQueuedAudio(g_devIdInp);
            }
        } else {
            tLastNoData = tNow;
        }
    } else {
        SDL_PauseAudioDevice(g_devIdOut, SDL_TRUE);
        SDL_PauseAudioDevice(g_devIdInp, SDL_TRUE);

        const auto nBytes = g_ggWave->encode();
        SDL_QueueAudio(g_devIdOut, g_ggWave->txWaveform(), nBytes);
    }

    return true;
}